

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_datatype_is_valid(int dtype,int for_nifti)

{
  int local_1c;
  int c;
  int tablen;
  int for_nifti_local;
  int dtype_local;
  
  if ((for_nifti == 0) || (dtype != 1)) {
    for (local_1c = 0x2a; 0 < local_1c; local_1c = local_1c + -1) {
      if (nifti_type_list[local_1c].type == dtype) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int nifti_datatype_is_valid( int dtype, int for_nifti )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    /* special case */
    if( for_nifti && dtype == DT_BINARY ) return 0;

    for( c = tablen-1; c > 0; c-- )
        if( nifti_type_list[c].type == dtype )
            return 1;

    return 0;
}